

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pstore::command_line::parser_base::add_literal_option
          (parser_base *this,string *name,int value,string *description)

{
  literal local_70;
  string *local_28;
  string *description_local;
  string *psStack_18;
  int value_local;
  string *name_local;
  parser_base *this_local;
  
  local_28 = description;
  description_local._4_4_ = value;
  psStack_18 = name;
  name_local = (string *)this;
  literal::literal(&local_70,name,value,description);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  emplace_back<pstore::command_line::literal>(&this->literals_,&local_70);
  literal::~literal(&local_70);
  return;
}

Assistant:

void parser_base::add_literal_option (std::string const & name, int const value,
                                                  std::string const & description) {
                literals_.emplace_back (literal{name, value, description});
            }